

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Dump.c
# Opt level: O0

void Llb_ManDumpReached(DdManager *ddG,DdNode *bReached,char *pModel,char *pFileName)

{
  DdNode *dd;
  uint n;
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  char *pcVar3;
  Vec_Ptr_t *p_00;
  FILE *__stream;
  char **inames;
  char **onames;
  void *pvVar4;
  int local_4c;
  int nDigits;
  int i;
  char *pName;
  Vec_Ptr_t *vNamesOut;
  Vec_Ptr_t *vNamesIn;
  FILE *pFile;
  char *pFileName_local;
  char *pModel_local;
  DdNode *bReached_local;
  DdManager *ddG_local;
  
  pModel_local = (char *)bReached;
  bReached_local = &ddG->sentinel;
  Cudd_ReduceHeap(ddG,CUDD_REORDER_SYMM_SIFT,1);
  n = Cudd_ReadSize((DdManager *)bReached_local);
  iVar1 = Abc_Base10Log(n);
  iVar2 = Cudd_ReadSize((DdManager *)bReached_local);
  p = Vec_PtrAlloc(iVar2);
  for (local_4c = 0; iVar2 = Cudd_ReadSize((DdManager *)bReached_local), local_4c < iVar2;
      local_4c = local_4c + 1) {
    pcVar3 = Llb_ManGetDummyName("ff",local_4c,iVar1);
    pcVar3 = Extra_UtilStrsav(pcVar3);
    Vec_PtrPush(p,pcVar3);
  }
  p_00 = Vec_PtrAlloc(1);
  pcVar3 = Extra_UtilStrsav("Reached");
  Vec_PtrPush(p_00,pcVar3);
  __stream = fopen(pFileName,"wb");
  dd = bReached_local;
  inames = (char **)Vec_PtrArray(p);
  onames = (char **)Vec_PtrArray(p_00);
  Cudd_DumpBlif((DdManager *)dd,1,(DdNode **)&pModel_local,inames,onames,pModel,(FILE *)__stream,0);
  fclose(__stream);
  for (local_4c = 0; iVar1 = Vec_PtrSize(p), local_4c < iVar1; local_4c = local_4c + 1) {
    pvVar4 = Vec_PtrEntry(p,local_4c);
    if (pvVar4 != (void *)0x0) {
      free(pvVar4);
    }
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(p_00), local_4c < iVar1; local_4c = local_4c + 1) {
    pvVar4 = Vec_PtrEntry(p_00,local_4c);
    if (pvVar4 != (void *)0x0) {
      free(pvVar4);
    }
  }
  Vec_PtrFree(p);
  Vec_PtrFree(p_00);
  return;
}

Assistant:

void Llb_ManDumpReached( DdManager * ddG, DdNode * bReached, char * pModel, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vNamesIn, * vNamesOut;
    char * pName;
    int i, nDigits;
    // reorder the BDD
    Cudd_ReduceHeap( ddG, CUDD_REORDER_SYMM_SIFT, 1 );

    // create input names
    nDigits = Abc_Base10Log( Cudd_ReadSize(ddG) );
    vNamesIn = Vec_PtrAlloc( Cudd_ReadSize(ddG) );
    for ( i = 0; i < Cudd_ReadSize(ddG); i++ )
    {
        pName = Llb_ManGetDummyName( "ff", i, nDigits );
        Vec_PtrPush( vNamesIn, Extra_UtilStrsav(pName) );
    }
    // create output names
    vNamesOut = Vec_PtrAlloc( 1 );
    Vec_PtrPush( vNamesOut, Extra_UtilStrsav("Reached") );

    // write the file
    pFile = fopen( pFileName, "wb" );
    Cudd_DumpBlif( ddG, 1, &bReached, (char **)Vec_PtrArray(vNamesIn), (char **)Vec_PtrArray(vNamesOut), pModel, pFile, 0 );
    fclose( pFile );

    // cleanup
    Vec_PtrForEachEntry( char *, vNamesIn, pName, i )
        ABC_FREE( pName );
    Vec_PtrForEachEntry( char *, vNamesOut, pName, i )
        ABC_FREE( pName );
    Vec_PtrFree( vNamesIn );
    Vec_PtrFree( vNamesOut );
}